

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O1

REF_STATUS ref_egads_edge_faces(REF_GEOM ref_geom,REF_INT **edge_face_arg)

{
  *edge_face_arg = (REF_INT *)0x0;
  printf("No EGADS linked for %s\n","ref_egads_edge_faces");
  return 6;
}

Assistant:

REF_FCN REF_STATUS ref_egads_edge_faces(REF_GEOM ref_geom,
                                        REF_INT **edge_face_arg) {
#ifdef HAVE_EGADS
  REF_INT *e2f, *nface;
  REF_INT face, edge;

  ego esurf, *eloops;
  int oclass, mtype, nloop, *senses;
  double data[18];
  ego ecurve, *eedges;
  int iloop, iedge, nedge;

  ref_malloc_init(*edge_face_arg, 2 * (ref_geom->nedge), REF_INT, REF_EMPTY);
  e2f = *edge_face_arg;
  ref_malloc_init(nface, (ref_geom->nedge), REF_INT, 0);

  for (face = 0; face < (ref_geom->nface); face++) {
    REIS(EGADS_SUCCESS,
         EG_getTopology(((ego *)(ref_geom->faces))[face], &esurf, &oclass,
                        &mtype, data, &nloop, &eloops, &senses),
         "topo");
    for (iloop = 0; iloop < nloop; iloop++) {
      /* loop through all Edges associated with this Loop */
      REIS(EGADS_SUCCESS,
           EG_getTopology(eloops[iloop], &ecurve, &oclass, &mtype, data, &nedge,
                          &eedges, &senses),
           "topo");
      for (iedge = 0; iedge < nedge; iedge++) {
        edge = EG_indexBodyTopo((ego)(ref_geom->body), eedges[iedge]) - 1;
        RAB(2 > nface[edge], "edge has more than 2 faces",
            printf("face ids %d %d %d edge id %d\n", e2f[0 + 2 * edge],
                   e2f[1 + 2 * edge], face + 1, edge + 1));
        e2f[nface[edge] + 2 * edge] = face + 1;
        nface[edge]++;
      }
    }
  }

  ref_free(nface);
  return REF_SUCCESS;
#else
  SUPRESS_UNUSED_COMPILER_WARNING(ref_geom);
  *edge_face_arg = NULL;
  printf("No EGADS linked for %s\n", __func__);
  return REF_IMPLEMENT;
#endif
}